

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestFreeList(void)

{
  bool bVar1;
  int iVar2;
  value_type pPVar3;
  reference ppPVar4;
  int local_6c;
  People *pPStack_68;
  int i_1;
  People *ptr;
  int i;
  undefined1 local_50 [8];
  FreeList freelist;
  list<People_*,_std::allocator<People_*>_> check_list;
  FixedAllocator<People> allocator;
  
  printf("===================== TestFreeList BEGIN =====================\n");
  tcmalloc::FixedAllocator<People>::FixedAllocator
            ((FixedAllocator<People> *)
             &check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node.
              _M_size);
  std::__cxx11::list<People_*,_std::allocator<People_*>_>::list
            ((list<People_*,_std::allocator<People_*>_> *)&freelist.head_);
  tcmalloc::FreeList::FreeList((FreeList *)local_50);
  bVar1 = tcmalloc::FreeList::Empty((FreeList *)local_50);
  if (!bVar1) {
    __assert_fail("freelist.Empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x3d,"void TestFreeList()");
  }
  ptr._0_4_ = 0;
  while( true ) {
    if (9 < (int)ptr) {
      local_6c = 10;
      while( true ) {
        if (local_6c < 1) {
          bVar1 = tcmalloc::FreeList::Empty((FreeList *)local_50);
          if (!bVar1) {
            __assert_fail("freelist.Empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                          ,0x4a,"void TestFreeList()");
          }
          printf("===================== TestFreeList Finish =====================\n");
          std::__cxx11::list<People_*,_std::allocator<People_*>_>::~list
                    ((list<People_*,_std::allocator<People_*>_> *)&freelist.head_);
          return;
        }
        iVar2 = tcmalloc::FreeList::FreeObjects((FreeList *)local_50);
        if (iVar2 != local_6c) break;
        pPVar3 = (value_type)tcmalloc::FreeList::PopFront((FreeList *)local_50);
        ppPVar4 = std::__cxx11::list<People_*,_std::allocator<People_*>_>::front
                            ((list<People_*,_std::allocator<People_*>_> *)&freelist.head_);
        if (pPVar3 != *ppPVar4) {
          __assert_fail("(People*)freelist.PopFront() == check_list.front()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                        ,0x46,"void TestFreeList()");
        }
        ppPVar4 = std::__cxx11::list<People_*,_std::allocator<People_*>_>::front
                            ((list<People_*,_std::allocator<People_*>_> *)&freelist.head_);
        tcmalloc::FixedAllocator<People>::Free
                  ((FixedAllocator<People> *)
                   &check_list.super__List_base<People_*,_std::allocator<People_*>_>._M_impl._M_node
                    ._M_size,*ppPVar4);
        std::__cxx11::list<People_*,_std::allocator<People_*>_>::pop_front
                  ((list<People_*,_std::allocator<People_*>_> *)&freelist.head_);
        local_6c = local_6c + -1;
      }
      __assert_fail("freelist.FreeObjects() == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                    ,0x45,"void TestFreeList()");
    }
    pPStack_68 = tcmalloc::FixedAllocator<People>::Alloc
                           ((FixedAllocator<People> *)
                            &check_list.super__List_base<People_*,_std::allocator<People_*>_>.
                             _M_impl._M_node._M_size);
    std::__cxx11::list<People_*,_std::allocator<People_*>_>::push_front
              ((list<People_*,_std::allocator<People_*>_> *)&freelist.head_,&stack0xffffffffffffff98
              );
    tcmalloc::FreeList::PushFront((FreeList *)local_50,pPStack_68);
    iVar2 = tcmalloc::FreeList::FreeObjects((FreeList *)local_50);
    if (iVar2 != (int)ptr + 1) break;
    ptr._0_4_ = (int)ptr + 1;
  }
  __assert_fail("freelist.FreeObjects() == (i+1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,0x42,"void TestFreeList()");
}

Assistant:

void TestFreeList() {
    printf("===================== TestFreeList BEGIN =====================\n");
    struct People {
        People(int age) : age_(age) {}
        int     age_;
        int     padding;
    };
    tcmalloc::FixedAllocator<People> allocator;

    std::list<People*> check_list;
    tcmalloc::FreeList freelist;
    assert(freelist.Empty());
    for (int i = 0; i < 10; ++i) {
        People* ptr = allocator.Alloc();
        check_list.push_front(ptr);
        freelist.PushFront(ptr);
        assert(freelist.FreeObjects() == (i+1));
    }
    for (int i = 10; i > 0; --i) {
        assert(freelist.FreeObjects() == i);
        assert((People*)freelist.PopFront() == check_list.front());
        allocator.Free(check_list.front());
        check_list.pop_front();
    }
    assert(freelist.Empty());
    printf("===================== TestFreeList Finish =====================\n");
}